

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O2

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::ExtendBuffer
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t newLength)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Data *pDVar5;
  Data *pDVar6;
  ulong uVar7;
  charcount_t cVar8;
  charcount_t cVar9;
  uint local_24;
  
  if (0x7ffffffe < newLength) {
    Throw::OutOfMemory();
  }
  uVar3 = this->length;
  if (0x7ffffffe < uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x74,"(this->length <= MaxLength)","this->length <= MaxLength");
    if (!bVar2) goto LAB_006c4269;
    *puVar4 = 0;
    uVar3 = this->length;
  }
  uVar3 = (uVar3 * 2) / 3 + newLength;
  if (0x7ffffffe < uVar3) {
    uVar3 = newLength;
  }
  if ((this->secondChunk == (Data *)0x0) &&
     ((this->firstChunk == (Data *)0x0 || (uVar3 - this->length < 0x41)))) {
    local_24 = this->initialSize + 1;
    if (local_24 < uVar3) {
      local_24 = uVar3;
    }
    if (0x7ffffffd < this->initialSize) {
      local_24 = 0x7ffffffe;
    }
    pDVar5 = NewSingleChunk(this,&local_24);
    if ((ulong)this->count == 0) {
      uVar7 = 0;
    }
    else {
      js_wmemcpy_s((char16 *)pDVar5,(ulong)local_24,(char16 *)this->firstChunk,(ulong)this->count);
      uVar7 = (ulong)this->count;
    }
    this->lastChunk = pDVar5;
    this->firstChunk = pDVar5;
    this->firstChunkLength = local_24;
    this->length = local_24;
    pDVar5 = (Data *)((long)&pDVar5->u + uVar7 * 2);
  }
  else {
    pDVar5 = NewChainedChunk(this,uVar3 - this->count);
    if (this->secondChunk == (Data *)0x0) {
      this->secondChunk = pDVar5;
      cVar9 = this->count;
      this->firstChunkLength = cVar9;
    }
    else {
      (this->lastChunk->u).chained.next = pDVar5;
      pDVar6 = this->lastChunk;
      uVar3 = (pDVar6->u).chained.length;
      cVar9 = this->length;
      cVar8 = this->count;
      if (uVar3 <= cVar9 - cVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                    ,0x87,
                                    "(this->lastChunk->u.chained.length > this->length - this->count)"
                                    ,
                                    "this->lastChunk->u.chained.length > this->length - this->count"
                                   );
        if (!bVar2) {
LAB_006c4269:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        cVar9 = this->length;
        cVar8 = this->count;
        pDVar6 = this->lastChunk;
        uVar3 = (pDVar6->u).chained.length;
      }
      (pDVar6->u).chained.length = (cVar8 - cVar9) + uVar3;
      cVar9 = this->count;
    }
    this->length = cVar9 + (pDVar5->u).chained.length;
    this->lastChunk = pDVar5;
    pDVar5 = pDVar5 + 1;
  }
  this->appendPtr = (char16 *)pDVar5;
  return;
}

Assistant:

_NOINLINE void ExtendBuffer(charcount_t newLength)
        {
            Data *newChunk;

            // To maintain this->length under MaxLength, check it here/throw, this is the only place we grow the buffer.
            if (newLength > MaxLength)
            {
                Throw::OutOfMemory();
            }

            Assert(this->length <= MaxLength);

            charcount_t newLengthTryGrowPolicy = newLength + (this->length*2/3); // Note: this would never result in uint32 overflow.
            if (newLengthTryGrowPolicy <= MaxLength)
            {
                newLength = newLengthTryGrowPolicy;
            }
            Assert(newLength <= MaxLength);

            // We already have linked chunks
            if (this->IsChained() || (this->firstChunk != NULL && newLength - this->length > MaxRealloc))
            {
                newChunk = this->NewChainedChunk(newLength - this->count);

                if (this->IsChained())
                {
                    this->lastChunk->u.chained.next = newChunk;

                    // We're not going to use the extra space in the current chunk...
                    Assert(this->lastChunk->u.chained.length > this->length - this->count);
                    this->lastChunk->u.chained.length -= (this->length - this->count);
                }
                else
                {
                    // Time to add our first linked chunk
                    Assert(this->secondChunk == NULL);
                    this->secondChunk = newChunk;

                    // We're not going to use the extra space in the current chunk...
                    this->firstChunkLength = this->count;
                }

                this->length = this->count + newChunk->u.chained.length;
                this->lastChunk = newChunk;
                this->appendPtr = newChunk->u.chained.buffer;
            }
            else
            {
                if (this->initialSize < MaxLength)
                {
                    newLength = max(newLength, this->initialSize + 1);
                }
                else
                {
                    newLength = MaxLength;
                }
                Assert(newLength <= MaxLength);

                // Let's just grow the current chunk in place
                newChunk = this->NewSingleChunk(&newLength);

                if (this->count)
                {
                    js_wmemcpy_s(newChunk->u.single.buffer, newLength, this->firstChunk->u.single.buffer, this->count);
                }

                this->firstChunk = this->lastChunk = newChunk;
                this->firstChunkLength = newLength;
                this->length = newLength;
                this->appendPtr = newChunk->u.single.buffer + this->count;
            }
        }